

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_settings::bulk_get
          (session_settings *this,
          function<void_(const_libtorrent::aux::session_settings_single_thread_&)> *f)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->m_mutex;
  local_28._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*f->_M_invoker)((_Any_data *)f,&this->m_store);
    ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void session_settings::bulk_get(std::function<void(session_settings_single_thread const&)> f) const
	{
		std::unique_lock<std::mutex> l(m_mutex);
		f(m_store);
	}